

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O0

void __thiscall vw::vw(vw *this)

{
  int iVar1;
  shared_data *psVar2;
  int **ppiVar3;
  long *in_RDI;
  size_t i;
  stack<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::deque<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&),_std::allocator<LEARNER::learner<char,_char>_*(*)(VW::config::options_i_&,_vw_&)>_>_>
  *in_stack_fffffffffffffee0;
  parameters *in_stack_fffffffffffffef0;
  long *local_50;
  ulong local_20;
  
  std::thread::thread((thread *)0x120440);
  std::__cxx11::string::string((string *)(in_RDI + 0xc));
  std::__cxx11::string::string((string *)(in_RDI + 0x14));
  version_struct::version_struct((version_struct *)(in_RDI + 0x18),0,0,0);
  *(undefined1 *)(in_RDI + 0x1b) = 0;
  vw_ostream::vw_ostream((vw_ostream *)in_stack_fffffffffffffef0);
  *(undefined1 *)(in_RDI + 0x4e) = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1204d6);
  std::__cxx11::string::string((string *)(in_RDI + 0x55));
  std::__cxx11::string::string((string *)(in_RDI + 0x59));
  std::__cxx11::string::string((string *)(in_RDI + 0x5d));
  std::__cxx11::string::string((string *)(in_RDI + 0x61));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x12055c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x120578);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x120594);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1205b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1205cc);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1205e8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x120604);
  local_50 = in_RDI + 899;
  do {
    std::
    vector<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
    ::vector((vector<v_hashmap<substring,_features_*>_*,_std::allocator<v_hashmap<substring,_features_*>_*>_>
              *)0x120646);
    local_50 = local_50 + 3;
  } while (local_50 != in_RDI + 0x683);
  std::vector<dictionary_info,_std::allocator<dictionary_info>_>::vector
            ((vector<dictionary_info,_std::allocator<dictionary_info>_> *)0x12067d);
  std::__cxx11::string::string((string *)(in_RDI + 0x690));
  std::__cxx11::string::string((string *)(in_RDI + 0x694));
  std::
  stack<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>>
  ::
  stack<std::deque<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&),std::allocator<LEARNER::learner<char,char>*(*)(VW::config::options_i&,vw&)>>,void>
            (in_stack_fffffffffffffee0);
  std::__cxx11::string::string((string *)(in_RDI + 0x6ae));
  parameters::parameters(in_stack_fffffffffffffef0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         *)0x120717);
  psVar2 = calloc_or_throw<shared_data>();
  *in_RDI = (long)psVar2;
  *(undefined4 *)(*in_RDI + 0x50) = 0x3f800000;
  *(undefined8 *)(*in_RDI + 0x60) = 0x3ff0000000000000;
  *(undefined4 *)(*in_RDI + 0xd4) = 0x7f7fffff;
  *(undefined1 *)(*in_RDI + 0xd0) = 0;
  *(undefined4 *)(*in_RDI + 0x6c) = 0;
  *(undefined4 *)(*in_RDI + 0x68) = 0;
  *(undefined4 *)(in_RDI + 0x6ca) = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  in_RDI[7] = 0;
  in_RDI[0x6a9] = 0;
  *(undefined4 *)(in_RDI + 0x67) = 0;
  in_RDI[9] = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0xc),"");
  in_RDI[0x686] = 0;
  *(undefined1 *)((long)in_RDI + 0x9c) = 0;
  *(undefined1 *)(in_RDI + 0x66) = 0;
  *(undefined1 *)((long)in_RDI + 0x9d) = 0;
  *(undefined1 *)((long)in_RDI + 0x343b) = 0;
  *(undefined4 *)(in_RDI + 10) = 0x12;
  *(undefined1 *)((long)in_RDI + 0x54) = 1;
  *(undefined1 *)(in_RDI + 0x10) = 0;
  in_RDI[0x11] = 10;
  *(undefined1 *)((long)in_RDI + 0x9e) = 0;
  *(undefined1 *)((long)in_RDI + 0x9f) = 0;
  *(undefined1 *)((long)in_RDI + 0x3451) = 0;
  *(undefined1 *)(in_RDI + 0x6b2) = 0;
  in_RDI[8] = (long)set_mm;
  *(undefined4 *)((long)in_RDI + 0x334) = 0x3f000000;
  *(undefined4 *)(in_RDI + 0x6ac) = 0x3f000000;
  in_RDI[0x69] = 1;
  in_RDI[0x6a4] = 0;
  ppiVar3 = v_array<int>::end((v_array<int> *)(in_RDI + 0x6a2));
  *ppiVar3 = (int *)0x0;
  ppiVar3 = v_array<int>::begin((v_array<int> *)(in_RDI + 0x6a2));
  *ppiVar3 = (int *)0x0;
  *(undefined4 *)(in_RDI + 0x6a6) = 0xffffffff;
  in_RDI[0x6a7] = (long)print_result;
  in_RDI[0x6a8] = (long)print_raw_text;
  *(undefined4 *)(in_RDI + 0x68f) = 0;
  in_RDI[0x688] = 0;
  *(undefined1 *)(in_RDI + 0x68a) = 0;
  *(undefined1 *)((long)in_RDI + 0x3452) = 0;
  *(undefined1 *)((long)in_RDI + 0x3453) = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x59),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x5d),"");
  std::__cxx11::string::operator=((string *)(in_RDI + 0x61),"");
  iVar1 = fileno(_stdout);
  *(int *)((long)in_RDI + 0x28c) = iVar1;
  in_RDI[0x50] = 0;
  *(undefined1 *)((long)in_RDI + 0x3455) = 0;
  *(undefined4 *)(in_RDI + 0x65) = 0;
  *(undefined4 *)((long)in_RDI + 0x32c) = 0;
  *(undefined4 *)((long)in_RDI + 0x3564) = 0x3f800000;
  *(undefined4 *)((long)in_RDI + 0x94) = 0;
  *(undefined4 *)(in_RDI + 0x13) = 0;
  in_RDI[4] = 0;
  for (local_20 = 0; local_20 < 0x100; local_20 = local_20 + 1) {
    *(undefined4 *)((long)in_RDI + local_20 * 4 + 0x6e8) = 0;
    *(undefined4 *)((long)in_RDI + local_20 * 4 + 0xae8) = 0;
    *(undefined4 *)((long)in_RDI + local_20 * 4 + 0xf00) = 0x7fffffff;
    in_RDI[local_20 + 0x260] = 0;
    *(undefined1 *)((long)in_RDI + local_20 + 0x1b00) = 0;
  }
  *(undefined1 *)((long)in_RDI + 0x343c) = 1;
  *(undefined1 *)((long)in_RDI + 0x343d) = 1;
  *(undefined1 *)((long)in_RDI + 0x343e) = 1;
  in_RDI[0x68e] = 2;
  *(undefined1 *)((long)in_RDI + 0x3454) = 1;
  *(undefined1 *)(in_RDI + 0x687) = 0;
  in_RDI[0x68] = -1;
  in_RDI[0x6a] = 0;
  *(undefined1 *)(in_RDI + 0x12) = 0;
  *(undefined1 *)(in_RDI + 0x6ab) = 0;
  *(undefined1 *)((long)in_RDI + 0x3456) = 0;
  *(undefined1 *)((long)in_RDI + 0x3457) = 1;
  *(undefined4 *)(in_RDI + 0x68c) = 0;
  in_RDI[0x68d] = 1;
  *(undefined1 *)(in_RDI + 0x68b) = 0;
  in_RDI[0x6c2] = -1;
  *(undefined1 *)(in_RDI + 0x6c3) = 0;
  *(undefined1 *)((long)in_RDI + 0x3619) = 0;
  *(undefined1 *)((long)in_RDI + 0x361a) = 0;
  *(undefined4 *)((long)in_RDI + 0x361c) = 0x40000000;
  *(undefined1 *)(*in_RDI + 0xd0) = 0;
  *(undefined4 *)(*in_RDI + 0xd4) = 0x7f7fffff;
  *(undefined4 *)(*in_RDI + 0xd8) = 0x7f7fffff;
  *(undefined1 *)(*in_RDI + 0xb8) = 0;
  *(undefined8 *)(*in_RDI + 0xc0) = 0;
  *(undefined8 *)(*in_RDI + 200) = 0;
  return;
}

Assistant:

vw::vw()
{
  sd = &calloc_or_throw<shared_data>();
  sd->dump_interval = 1.;  // next update progress dump
  sd->contraction = 1.;
  sd->first_observed_label = FLT_MAX;
  sd->is_more_than_two_labels_observed = false;
  sd->max_label = 0;
  sd->min_label = 0;

  label_type = label_type::simple;

  l = nullptr;
  scorer = nullptr;
  cost_sensitive = nullptr;
  loss = nullptr;

  reg_mode = 0;
  current_pass = 0;

  data_filename = "";
  delete_prediction = nullptr;

  bfgs = false;
  no_bias = false;
  hessian_on = false;
  active = false;
  num_bits = 18;
  default_bits = true;
  daemon = false;
  num_children = 10;
  save_resume = false;
  preserve_performance_counters = false;

  random_positive_weights = false;

  weights.sparse = false;

  set_minmax = set_mm;

  power_t = 0.5;
  eta = 0.5;  // default learning rate for normalized adaptive updates, this is switched to 10 by default for the other
              // updates (see parse_args.cc)
  numpasses = 1;

  final_prediction_sink.begin() = final_prediction_sink.end() = final_prediction_sink.end_array = nullptr;
  raw_prediction = -1;
  print = print_result;
  print_text = print_raw_text;
  lda = 0;
  random_seed = 0;
  random_weights = false;
  normal_weights = false;
  tnormal_weights = false;
  per_feature_regularizer_input = "";
  per_feature_regularizer_output = "";
  per_feature_regularizer_text = "";

#ifdef _WIN32
  stdout_fileno = _fileno(stdout);
#else
  stdout_fileno = fileno(stdout);
#endif

  searchstr = nullptr;

  nonormalize = false;
  l1_lambda = 0.0;
  l2_lambda = 0.0;

  eta_decay_rate = 1.0;
  initial_weight = 0.0;
  initial_constant = 0.0;

  all_reduce = nullptr;

  for (size_t i = 0; i < 256; i++)
  {
    ngram[i] = 0;
    skips[i] = 0;
    limit[i] = INT_MAX;
    affix_features[i] = 0;
    spelling_features[i] = 0;
  }

  // by default use invariant normalized adaptive updates
  adaptive = true;
  normalized_updates = true;
  invariant_updates = true;
  normalized_idx = 2;

  add_constant = true;
  audit = false;

  pass_length = (size_t)-1;
  passes_complete = 0;

  save_per_pass = false;

  stdin_off = false;
  do_reset_source = false;
  holdout_set_off = true;
  holdout_after = 0;
  check_holdout_every_n_passes = 1;
  early_terminate = false;

  max_examples = (size_t)-1;

  hash_inv = false;
  print_invert = false;

  // Set by the '--progress <arg>' option and affect sd->dump_interval
  progress_add = false;  // default is multiplicative progress dumps
  progress_arg = 2.0;    // next update progress dump multiplier

  sd->is_more_than_two_labels_observed = false;
  sd->first_observed_label = FLT_MAX;
  sd->second_observed_label = FLT_MAX;

  sd->report_multiclass_log_loss = false;
  sd->multiclass_log_loss = 0;
  sd->holdout_multiclass_log_loss = 0;
}